

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O0

void __thiscall
CommandDrawSwitchableImage::Parse
          (CommandDrawSwitchableImage *this,FScanner *sc,bool fullScreenOffsets)

{
  bool bVar1;
  int iVar2;
  PClass *ti;
  uint uVar3;
  uint local_44;
  uint i;
  PClass *item_1;
  PClass *local_30;
  PClass *item;
  undefined1 local_20 [15];
  bool fullScreenOffsets_local;
  FScanner *sc_local;
  CommandDrawSwitchableImage *this_local;
  
  local_20[7] = fullScreenOffsets;
  unique0x10000620 = (SBarInfo *)sc;
  sc_local = (FScanner *)this;
  bVar1 = FScanner::CheckToken(sc,0x102);
  if (!bVar1) {
    FScanner::MustGetToken((FScanner *)stack0xffffffffffffffe8,0x101);
  }
  if ((stack0xffffffffffffffe8->Images).Count == 0x101) {
    bVar1 = FScanner::Compare((FScanner *)stack0xffffffffffffffe8,"weaponslot");
    if (bVar1) {
      this->condition = WEAPONSLOT;
      FScanner::MustGetToken((FScanner *)stack0xffffffffffffffe8,0x104);
      this->conditionalValue[0] = *(int *)stack0xffffffffffffffe8->huds;
    }
    else {
      bVar1 = FScanner::Compare((FScanner *)stack0xffffffffffffffe8,"invulnerable");
      if (bVar1) {
        this->condition = INVULNERABILITY;
      }
      else {
        bVar1 = FScanner::Compare((FScanner *)stack0xffffffffffffffe8,"keyslot");
        if (bVar1) {
          this->condition = KEYSLOT;
          FScanner::MustGetToken((FScanner *)stack0xffffffffffffffe8,0x104);
          this->conditionalValue[0] = *(int *)stack0xffffffffffffffe8->huds;
          LookupKeySpecies((CommandDrawSwitchableImage *)local_20,this->conditionalValue[0]);
          FName::operator=(this->keySpecies,(FName *)local_20);
        }
        else {
          bVar1 = FScanner::Compare((FScanner *)stack0xffffffffffffffe8,"armortype");
          if (bVar1) {
            this->condition = ARMORTYPE;
            FScanner::MustGetToken((FScanner *)stack0xffffffffffffffe8,0x101);
            FName::FName((FName *)((long)&item + 4),(char *)(stack0xffffffffffffffe8->Images).Array)
            ;
            iVar2 = FName::GetIndex((FName *)((long)&item + 4));
            this->armorType[0] = iVar2;
            GetOperation((FScanner *)stack0xffffffffffffffe8,this->conditionalOperator,
                         this->conditionalValue);
          }
        }
      }
    }
  }
  if (this->condition == INVENTORY) {
    FString::operator=(this->inventoryItem,(char *)(stack0xffffffffffffffe8->Images).Array);
    local_30 = PClass::FindClass((char *)(stack0xffffffffffffffe8->Images).Array);
    if ((local_30 == (PClass *)0x0) ||
       (bVar1 = PClass::IsAncestorOf(AInventory::RegistrationInfo.MyClass,local_30), !bVar1)) {
      FScanner::ScriptMessage
                ((FScanner *)stack0xffffffffffffffe8,"\'%s\' is not a type of inventory item.",
                 (stack0xffffffffffffffe8->Images).Array);
    }
    GetOperation((FScanner *)stack0xffffffffffffffe8,this->conditionalOperator,
                 this->conditionalValue);
  }
  bVar1 = FScanner::CheckToken((FScanner *)stack0xffffffffffffffe8,0x11b);
  if ((bVar1) && (this->condition != INVULNERABILITY)) {
    this->conditionAnd = true;
    if ((this->condition == KEYSLOT) || (this->condition == WEAPONSLOT)) {
      FScanner::MustGetToken((FScanner *)stack0xffffffffffffffe8,0x104);
      this->conditionalValue[1] = *(int *)stack0xffffffffffffffe8->huds;
      if (this->condition == KEYSLOT) {
        LookupKeySpecies((CommandDrawSwitchableImage *)((long)&item_1 + 4),this->conditionalValue[1]
                        );
        FName::operator=(this->keySpecies + 1,(FName *)((long)&item_1 + 4));
      }
    }
    else if (this->condition == ARMORTYPE) {
      FScanner::MustGetToken((FScanner *)stack0xffffffffffffffe8,0x101);
      FName::FName((FName *)&item_1,(char *)(stack0xffffffffffffffe8->Images).Array);
      iVar2 = FName::GetIndex((FName *)&item_1);
      this->armorType[1] = iVar2;
      GetOperation((FScanner *)stack0xffffffffffffffe8,this->conditionalOperator + 1,
                   this->conditionalValue + 1);
    }
    else {
      FScanner::MustGetToken((FScanner *)stack0xffffffffffffffe8,0x101);
      FString::operator=(this->inventoryItem + 1,(char *)(stack0xffffffffffffffe8->Images).Array);
      ti = PClass::FindClass((char *)(stack0xffffffffffffffe8->Images).Array);
      if ((ti == (PClass *)0x0) ||
         (bVar1 = PClass::IsAncestorOf(AInventory::RegistrationInfo.MyClass,ti), !bVar1)) {
        FScanner::ScriptMessage
                  ((FScanner *)stack0xffffffffffffffe8,"\'%s\' is not a type of inventory item.",
                   (stack0xffffffffffffffe8->Images).Array);
      }
      GetOperation((FScanner *)stack0xffffffffffffffe8,this->conditionalOperator + 1,
                   this->conditionalValue + 1);
    }
  }
  local_44 = 0;
  while( true ) {
    uVar3 = 1;
    if ((this->conditionAnd & 1U) != 0) {
      uVar3 = 3;
    }
    if (uVar3 <= local_44) break;
    FScanner::MustGetToken((FScanner *)stack0xffffffffffffffe8,0x2c);
    FScanner::MustGetToken((FScanner *)stack0xffffffffffffffe8,0x102);
    iVar2 = SBarInfo::newImage((this->super_CommandDrawImage).super_SBarInfoCommandFlowControl.
                               super_SBarInfoCommand.script,
                               (char *)(stack0xffffffffffffffe8->Images).Array);
    this->conditionalImage[local_44] = iVar2;
    local_44 = local_44 + 1;
  }
  FScanner::MustGetToken((FScanner *)stack0xffffffffffffffe8,0x2c);
  CommandDrawImage::Parse
            (&this->super_CommandDrawImage,(FScanner *)stack0xffffffffffffffe8,
             (bool)(local_20[7] & 1));
  return;
}

Assistant:

void	Parse(FScanner &sc, bool fullScreenOffsets)
		{
			if(!sc.CheckToken(TK_StringConst))
				sc.MustGetToken(TK_Identifier);
			if(sc.TokenType == TK_Identifier)
			{
				if(sc.Compare("weaponslot"))
				{
					condition = WEAPONSLOT;
					sc.MustGetToken(TK_IntConst);
					conditionalValue[0] = sc.Number;
				}
				else if(sc.Compare("invulnerable"))
				{
					condition = INVULNERABILITY;
				}
				else if(sc.Compare("keyslot"))
				{
					condition = KEYSLOT;
					sc.MustGetToken(TK_IntConst);
					conditionalValue[0] = sc.Number;
					keySpecies[0] = LookupKeySpecies(conditionalValue[0]);
				}
				else if(sc.Compare("armortype"))
				{
					condition = ARMORTYPE;
					sc.MustGetToken(TK_Identifier);
					armorType[0] = FName(sc.String).GetIndex();
					GetOperation(sc, conditionalOperator[0], conditionalValue[0]);
				}
			}
			if(condition == INVENTORY)
			{
				inventoryItem[0] = sc.String;
				const PClass* item = PClass::FindClass(sc.String);
				if(item == NULL || !RUNTIME_CLASS(AInventory)->IsAncestorOf(item)) //must be a kind of Inventory
				{
					sc.ScriptMessage("'%s' is not a type of inventory item.", sc.String);
				}
				GetOperation(sc, conditionalOperator[0], conditionalValue[0]);
			}
			if(sc.CheckToken(TK_AndAnd) && condition != INVULNERABILITY)
			{
				conditionAnd = true;
				if(condition == KEYSLOT || condition == WEAPONSLOT)
				{
					sc.MustGetToken(TK_IntConst);
					conditionalValue[1] = sc.Number;
					if(condition == KEYSLOT)
						keySpecies[1] = LookupKeySpecies(conditionalValue[1]);
				}
				else if(condition == ARMORTYPE)
				{
					sc.MustGetToken(TK_Identifier);
					armorType[1] = FName(sc.String).GetIndex();
					GetOperation(sc, conditionalOperator[1], conditionalValue[1]);
				}
				else
				{
					sc.MustGetToken(TK_Identifier);
					inventoryItem[1] = sc.String;
					const PClass* item = PClass::FindClass(sc.String);
					if(item == NULL || !RUNTIME_CLASS(AInventory)->IsAncestorOf(item)) //must be a kind of Inventory
					{
						sc.ScriptMessage("'%s' is not a type of inventory item.", sc.String);
					}
					GetOperation(sc, conditionalOperator[1], conditionalValue[1]);
				}
			}
			// [BL] I have word that MSVC++ wants this static_cast ;)  Shut up MSVC!
			for(unsigned int i = 0;i < (conditionAnd ? 3u : 1u);i++)
			{
				sc.MustGetToken(',');
				sc.MustGetToken(TK_StringConst);
				conditionalImage[i] = script->newImage(sc.String);
			}
			sc.MustGetToken(',');
			CommandDrawImage::Parse(sc, fullScreenOffsets);
		}